

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall llvm::DWARFVerifier::verifyDebugInfoReferences(DWARFVerifier *this)

{
  char *pcVar1;
  raw_ostream *prVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  char *Offset;
  void *__buf;
  undefined1 in_R8B;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  DWARFDie DVar5;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_90;
  DWARFDie local_60;
  char *local_50;
  _Rb_tree_node_base *local_48;
  DWARFUnit *local_40;
  ulong local_38;
  
  Str.Length = 0x24;
  Str.Data = "Verifying .debug_info references...\n";
  raw_ostream::operator<<(this->OS,Str);
  p_Var4 = (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 == local_48) {
    local_38 = 0;
  }
  else {
    local_38 = 0;
    local_40 = (DWARFUnit *)&PTR_home_00d77818;
    do {
      Offset = *(char **)(p_Var4 + 1);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&p_Var4[1]._M_parent);
      DVar5 = DWARFContext::getDIEForOffset(this->DCtx,(uint64_t)Offset);
      if (DVar5.U == (DWARFUnit *)0x0 || DVar5.Die == (DWARFDebugInfoEntry *)0x0) {
        prVar2 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_00.Length = 0x16;
        Str_00.Data = "invalid DIE reference ";
        prVar2 = raw_ostream::operator<<(prVar2,Str_00);
        local_60.Die = (DWARFDebugInfoEntry *)0xbc3863;
        local_60.U = local_40;
        local_50 = Offset;
        prVar2 = raw_ostream::operator<<(prVar2,(format_object_base *)&local_60);
        Str_01.Length = 0x1d;
        Str_01.Data = ". Offset is in between DIEs:\n";
        raw_ostream::operator<<(prVar2,Str_01);
        for (p_Var3 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var3 != &local_90._M_impl.super__Rb_tree_header;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
          local_60 = DWARFContext::getDIEForOffset(this->DCtx,*(uint64_t *)(p_Var3 + 1));
          DWARFDie::dump(&local_60,this->OS,0,this->DumpOpts);
          prVar2 = this->OS;
          pcVar1 = prVar2->OutBufCur;
          if (pcVar1 < prVar2->OutBufEnd) {
            Offset = pcVar1 + 1;
            prVar2->OutBufCur = Offset;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(prVar2,10,__buf,(size_t)Offset);
          }
        }
        Str_02.Length = 1;
        Str_02.Data = "\n";
        raw_ostream::operator<<(this->OS,Str_02);
        local_38 = (ulong)((int)local_38 + 1);
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_90);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_48);
  }
  return (uint)local_38;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoReferences() {
  // Take all references and make sure they point to an actual DIE by
  // getting the DIE by offset and emitting an error
  OS << "Verifying .debug_info references...\n";
  unsigned NumErrors = 0;
  for (const std::pair<uint64_t, std::set<uint64_t>> &Pair :
       ReferenceToDIEOffsets) {
    if (DCtx.getDIEForOffset(Pair.first))
      continue;
    ++NumErrors;
    error() << "invalid DIE reference " << format("0x%08" PRIx64, Pair.first)
            << ". Offset is in between DIEs:\n";
    for (auto Offset : Pair.second)
      dump(DCtx.getDIEForOffset(Offset)) << '\n';
    OS << "\n";
  }
  return NumErrors;
}